

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventQueue.cpp
# Opt level: O2

void __thiscall EventQueue::Remove(EventQueue *this,Id id)

{
  iterator iVar1;
  Node *pNVar2;
  iterator i;
  AutoLock _auto_lock_;
  iterator local_40;
  AutoLock local_38;
  
  AutoLock::AutoLock(&local_38,&this->mLock,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/EventQueue.cpp"
                     ,0x83);
  iVar1.mNode = ((this->mQueue).mHead)->next;
LAB_001180cb:
  if (iVar1.mNode == (this->mQueue).mTail) {
    AutoLock::~AutoLock(&local_38);
    return;
  }
  pNVar2 = iVar1.mNode;
  if (*(int *)&((iVar1.mNode)->val->super_RefCount).field_0xc == id) goto LAB_001180dc;
  goto LAB_0011810c;
LAB_001180dc:
  RefCount::Release(&(iVar1.mNode)->val->super_RefCount);
  JetHead::list<Event_*>::iterator::erase(&local_40);
  iVar1.mNode = local_40.mNode;
  if (local_40.mNode != (Node *)0x0) {
    pNVar2 = (local_40.mNode)->prev;
    iVar1.mNode = (Node *)0x0;
    if (pNVar2 != (Node *)0x0) {
LAB_0011810c:
      iVar1.mNode = pNVar2->next;
    }
  }
  goto LAB_001180cb;
}

Assistant:

void EventQueue::Remove( Event::Id id )
{
	DebugAutoLock( mLock );
	
	for (JetHead::list<Event*>::iterator i = mQueue.begin(); i != mQueue.end(); ++i)
	{
		if ((*i)->getEventId() == id)
		{
			(*i)->Release();
			i = i.erase();
			--i;
		}
	}
}